

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImDrawDataBuilder::Clear(ImDrawDataBuilder *this)

{
  int *piVar1;
  int iVar2;
  void *pvVar3;
  void *__dest;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar4 = 0;
  do {
    iVar2 = *(int *)((long)&this->Layers[0].Capacity + lVar4);
    if (iVar2 < 0) {
      uVar5 = iVar2 / 2 + iVar2;
      uVar6 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar6 = 0;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (*GImAllocatorAllocFunc)(uVar6 * 8,GImAllocatorUserData);
      pvVar3 = *(void **)((long)&this->Layers[0].Data + lVar4);
      if (pvVar3 != (void *)0x0) {
        memcpy(__dest,pvVar3,(long)*(int *)((long)&this->Layers[0].Size + lVar4) << 3);
        pvVar3 = *(void **)((long)&this->Layers[0].Data + lVar4);
        if ((pvVar3 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar3,GImAllocatorUserData);
      }
      *(void **)((long)&this->Layers[0].Data + lVar4) = __dest;
      *(int *)((long)&this->Layers[0].Capacity + lVar4) = (int)uVar6;
    }
    *(undefined4 *)((long)&this->Layers[0].Size + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 == 0x10);
  return;
}

Assistant:

void Clear()            { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].resize(0); }